

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model.hpp
# Opt level: O2

void __thiscall
cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense>::add_variables_from
          (BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense> *this,
          Linear<unsigned_int,_double> *linear)

{
  __node_base *p_Var1;
  
  p_Var1 = &(linear->_M_h)._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    add_variable(this,(uint *)(p_Var1 + 1),(double *)(p_Var1 + 2));
  }
  return;
}

Assistant:

void add_variables_from( const Linear<IndexType, FloatType> &linear ) {
      for ( auto &it : linear ) {
        add_variable( it.first, it.second );
      }
    }